

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>::setCapacity
          (Vector<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *this,
          size_t newSize)

{
  RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pRVar1;
  Located<capnp::Text::Reader> *pLVar2;
  ArrayDisposer *pAVar3;
  Located<capnp::Text::Reader> *__dest;
  ulong uVar4;
  Located<capnp::Text::Reader> *pLVar5;
  size_t __n;
  
  pLVar5 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pLVar5 >> 3) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pLVar5 + newSize;
  }
  __dest = (Located<capnp::Text::Reader> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pLVar5 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pLVar5;
  if (__n != 0) {
    memcpy(__dest,pLVar5,__n);
    pLVar5 = (this->builder).ptr;
  }
  if (pLVar5 != (Located<capnp::Text::Reader> *)0x0) {
    pRVar1 = (this->builder).pos;
    pLVar2 = (this->builder).endPtr;
    (this->builder).ptr = (Located<capnp::Text::Reader> *)0x0;
    (this->builder).pos =
         (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
    (this->builder).endPtr = (Located<capnp::Text::Reader> *)0x0;
    pAVar3 = (this->builder).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pLVar5,0x18,((long)pRVar1 - (long)pLVar5 >> 3) * -0x5555555555555555,
               ((long)pLVar2 - (long)pLVar5 >> 3) * -0x5555555555555555,0);
  }
  (this->builder).ptr = __dest;
  (this->builder).pos =
       (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)
       ((long)__dest + __n);
  (this->builder).endPtr = __dest + newSize;
  (this->builder).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }